

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::add_segment(CTcEmbedBuilderSgl *this,CTcPrsNode *cur)

{
  CTcToken *this_00;
  size_t sVar1;
  CTPNConst *this_01;
  CTPNAdd *this_02;
  CTPNConst *in_RSI;
  CTcConstVal cval;
  CTcConstVal *this_03;
  CTcToken *in_stack_ffffffffffffffa8;
  CTcConstVal *in_stack_ffffffffffffffb0;
  CTcConstVal local_38;
  CTPNConst *local_10;
  
  local_10 = in_RSI;
  this_00 = CTcTokenizer::getcur(G_tok);
  sVar1 = CTcToken::get_text_len(this_00);
  if (sVar1 != 0) {
    this_03 = &local_38;
    CTcConstVal::CTcConstVal(this_03);
    CTcTokenizer::getcur(G_tok);
    CTcConstVal::set_sstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    this_01 = (CTPNConst *)CTcPrsAllocObj::operator_new(0x263d32);
    this_02 = (CTPNAdd *)CTcPrsAllocObj::operator_new(0x263d4b);
    CTPNConst::CTPNConst(this_01,this_03);
    CTPNAdd::CTPNAdd(this_02,(CTcPrsNode *)local_10,(CTcPrsNode *)this_01);
    local_10 = this_01;
  }
  return (CTcPrsNode *)local_10;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {        
        /* 
         *   Add the next string segment.  We can omit it if it's zero
         *   length, as this will add nothing to the result.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            CTcConstVal cval;
            cval.set_sstr(G_tok->getcur());
            cur = new CTPNAdd(cur, new CTPNConst(&cval));
        }
        
        /* return the new combined node */
        return cur;
    }